

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv.c
# Opt level: O2

void WebPConvertARGBToUV_C(uint32_t *argb,uint8_t *u,uint8_t *v,int src_width,int do_store)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  
  uVar5 = 0;
  uVar3 = (ulong)(uint)(src_width >> 1);
  if (src_width >> 1 < 1) {
    uVar3 = uVar5;
  }
  for (; uVar3 != uVar5; uVar5 = uVar5 + 1) {
    uVar8 = argb[uVar5 * 2];
    uVar9 = argb[uVar5 * 2 + 1];
    iVar7 = (uVar9 >> 0xf & 0x1fe) + (uVar8 >> 0xf & 0x1fe);
    iVar1 = (uVar8 >> 7 & 0x1fe) + (uVar9 >> 8 & 0xff) * 2;
    iVar2 = (uVar8 & 0xff) * 2 + (uVar9 & 0xff) * 2;
    uVar8 = (uint)(iVar2 * 0x7080 + 0x2020000 + iVar1 * -0x4a89 + iVar7 * -0x25f7) >> 0x12;
    uVar9 = (uint)(iVar2 * -0x124c + 0x2020000 + iVar1 * -0x5e34 + iVar7 * 0x7080) >> 0x12;
    if (do_store == 0) {
      u[uVar5] = (uint8_t)(uVar8 + u[uVar5] + 1 >> 1);
      v[uVar5] = (uint8_t)(uVar9 + v[uVar5] + 1 >> 1);
    }
    else {
      u[uVar5] = (uint8_t)uVar8;
      v[uVar5] = (uint8_t)uVar9;
    }
  }
  if ((src_width & 1U) != 0) {
    uVar8 = argb[(uint)((int)uVar3 * 2)];
    uVar6 = uVar8 >> 0xe & 0x3fc;
    uVar4 = uVar8 >> 6 & 0x3fc;
    uVar9 = (uVar8 & 0xff) * 0x1c200 + 0x2020000 + uVar4 * -0x4a89 + uVar6 * -0x25f7 >> 0x12;
    uVar8 = (uVar8 & 0xff) * -0x4930 + 0x2020000 + uVar4 * -0x5e34 + uVar6 * 0x7080 >> 0x12;
    if (do_store == 0) {
      u[uVar3] = (uint8_t)(uVar9 + u[uVar3] + 1 >> 1);
      v[uVar3] = (uint8_t)(v[uVar3] + uVar8 + 1 >> 1);
    }
    else {
      u[uVar3] = (uint8_t)uVar9;
      v[uVar3] = (uint8_t)uVar8;
    }
  }
  return;
}

Assistant:

void WebPConvertARGBToUV_C(const uint32_t* argb, uint8_t* u, uint8_t* v,
                           int src_width, int do_store) {
  // No rounding. Last pixel is dealt with separately.
  const int uv_width = src_width >> 1;
  int i;
  for (i = 0; i < uv_width; ++i) {
    const uint32_t v0 = argb[2 * i + 0];
    const uint32_t v1 = argb[2 * i + 1];
    // VP8RGBToU/V expects four accumulated pixels. Hence we need to
    // scale r/g/b value by a factor 2. We just shift v0/v1 one bit less.
    const int r = ((v0 >> 15) & 0x1fe) + ((v1 >> 15) & 0x1fe);
    const int g = ((v0 >>  7) & 0x1fe) + ((v1 >>  7) & 0x1fe);
    const int b = ((v0 <<  1) & 0x1fe) + ((v1 <<  1) & 0x1fe);
    const int tmp_u = VP8RGBToU(r, g, b, YUV_HALF << 2);
    const int tmp_v = VP8RGBToV(r, g, b, YUV_HALF << 2);
    if (do_store) {
      u[i] = tmp_u;
      v[i] = tmp_v;
    } else {
      // Approximated average-of-four. But it's an acceptable diff.
      u[i] = (u[i] + tmp_u + 1) >> 1;
      v[i] = (v[i] + tmp_v + 1) >> 1;
    }
  }
  if (src_width & 1) {       // last pixel
    const uint32_t v0 = argb[2 * i + 0];
    const int r = (v0 >> 14) & 0x3fc;
    const int g = (v0 >>  6) & 0x3fc;
    const int b = (v0 <<  2) & 0x3fc;
    const int tmp_u = VP8RGBToU(r, g, b, YUV_HALF << 2);
    const int tmp_v = VP8RGBToV(r, g, b, YUV_HALF << 2);
    if (do_store) {
      u[i] = tmp_u;
      v[i] = tmp_v;
    } else {
      u[i] = (u[i] + tmp_u + 1) >> 1;
      v[i] = (v[i] + tmp_v + 1) >> 1;
    }
  }
}